

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O0

void empty_opendir_cb(uv_fs_t *req)

{
  void *dir_00;
  int iVar1;
  uv_loop_t *loop;
  int r;
  uv_dir_t *dir;
  uv_fs_t *req_local;
  
  dir_00 = opendir_req.ptr;
  if (req != &opendir_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x4d,"req == &opendir_req");
    abort();
  }
  if (opendir_req.fs_type != UV_FS_OPENDIR) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x4e,"req->fs_type == UV_FS_OPENDIR");
    abort();
  }
  if (opendir_req.result != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x4f,"req->result == 0");
    abort();
  }
  if (opendir_req.ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x50,"req->ptr != NULL");
    abort();
  }
  *(uv_dirent_t **)opendir_req.ptr = dirents;
  *(undefined8 *)((long)dir_00 + 8) = 1;
  loop = uv_default_loop();
  iVar1 = uv_fs_readdir(loop,&readdir_req,(uv_dir_t *)dir_00,empty_readdir_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-readdir.c"
            ,0x58,"r == 0");
    abort();
  }
  uv_fs_req_cleanup(&opendir_req);
  empty_opendir_cb_count = empty_opendir_cb_count + 1;
  return;
}

Assistant:

static void empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT(req == &opendir_req);
  ASSERT(req->fs_type == UV_FS_OPENDIR);
  ASSERT(req->result == 0);
  ASSERT(req->ptr != NULL);
  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    empty_readdir_cb);
  ASSERT(r == 0);
  uv_fs_req_cleanup(req);
  ++empty_opendir_cb_count;
}